

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  LodePNGColorType LVar1;
  size_t sVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  uchar uVar10;
  uchar uVar11;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uchar *local_50;
  undefined2 uVar12;
  
  LVar1 = info->colortype;
  if (LVar1 == LCT_GREY) {
    if (info->key_defined == 0) goto LAB_0010e6bd;
    uVar3 = info->key_r;
    uVar13 = 1;
    local_50 = (uchar *)malloc(1);
    bVar17 = local_50 != (uchar *)0x0;
    if (bVar17) {
      *local_50 = (uchar)(uVar3 >> 8);
      uVar13 = 2;
    }
    uVar9 = (ulong)bVar17;
    uVar15 = 0;
    if ((uint)uVar13 <= (uint)bVar17 * 2) {
      uVar15 = uVar13 >> 1;
    }
    puVar4 = (uchar *)realloc(local_50,uVar15 + uVar13);
    if (puVar4 == (uchar *)0x0) goto LAB_0010e946;
    puVar5 = puVar4 + uVar13;
    uVar9 = uVar13;
LAB_0010e93a:
    puVar5[-1] = (uchar)uVar3;
    local_50 = puVar4;
  }
  else {
    if (LVar1 == LCT_RGB) {
      if (info->key_defined != 0) {
        uVar3 = info->key_r;
        uVar9 = 1;
        local_50 = (uchar *)malloc(1);
        bVar17 = local_50 != (uchar *)0x0;
        if (bVar17) {
          *local_50 = (uchar)(uVar3 >> 8);
          uVar9 = 2;
        }
        uVar15 = (ulong)bVar17;
        uVar13 = 0;
        if ((uint)uVar9 <= (uint)bVar17 * 2) {
          uVar13 = uVar9 >> 1;
        }
        uVar16 = uVar13 + uVar9;
        puVar4 = (uchar *)realloc(local_50,uVar16);
        if (puVar4 == (uchar *)0x0) {
          uVar12 = (undefined2)info->key_g;
          uVar6 = uVar15 + 1;
          uVar9 = uVar15;
          uVar16 = uVar15;
LAB_0010e7c2:
          uVar11 = (uchar)uVar12;
          uVar10 = (uchar)((ushort)uVar12 >> 8);
          uVar13 = 0;
          if ((uint)uVar9 < (uint)((int)uVar16 * 2)) {
            uVar13 = uVar6 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar6);
          uVar15 = uVar6;
          sVar2 = uVar13 + uVar6;
          if (puVar4 != (uchar *)0x0) goto LAB_0010e807;
        }
        else {
          puVar4[uVar9 - 1] = (uchar)uVar3;
          uVar12 = (undefined2)info->key_g;
          uVar10 = (uchar)(info->key_g >> 8);
          uVar6 = uVar9 + 1;
          local_50 = puVar4;
          sVar2 = uVar16;
          if (uVar13 == 0) goto LAB_0010e7c2;
LAB_0010e807:
          uVar16 = sVar2;
          puVar4[uVar6 - 1] = uVar10;
          uVar11 = (uchar)info->key_g;
          uVar15 = uVar9 + 2;
          local_50 = puVar4;
          uVar9 = uVar6;
        }
        puVar4 = local_50;
        sVar2 = uVar16;
        if ((uint)uVar9 < (uint)uVar16) {
LAB_0010e86c:
          uVar16 = sVar2;
          puVar4[uVar15 - 1] = uVar11;
          uVar6 = uVar15 + 1;
          local_50 = puVar4;
          uVar9 = uVar15;
        }
        else {
          uVar13 = 0;
          if ((uint)uVar9 < (uint)uVar16 * 2) {
            uVar13 = uVar15 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar15);
          uVar6 = uVar15;
          sVar2 = uVar13 + uVar15;
          if (puVar4 != (uchar *)0x0) goto LAB_0010e86c;
        }
        uVar10 = *(uchar *)((long)&info->key_b + 1);
        uVar7 = (uint)uVar16;
        puVar4 = local_50;
        if ((uint)uVar9 < uVar7) {
LAB_0010e8bf:
          uVar7 = (uint)uVar16;
          puVar4[uVar6 - 1] = uVar10;
          uVar9 = uVar6;
          local_50 = puVar4;
          uVar6 = uVar6 + 1;
        }
        else {
          uVar16 = 0;
          if ((uint)uVar9 < uVar7 * 2) {
            uVar16 = uVar6 >> 1;
          }
          uVar16 = uVar16 + uVar6;
          puVar4 = (uchar *)realloc(local_50,uVar16);
          if (puVar4 != (uchar *)0x0) goto LAB_0010e8bf;
        }
        uVar3 = info->key_b;
        puVar4 = local_50;
        if (uVar7 <= (uint)uVar9) {
          uVar13 = 0;
          if ((uint)uVar9 < uVar7 * 2) {
            uVar13 = uVar6 >> 1;
          }
          puVar4 = (uchar *)realloc(local_50,uVar13 + uVar6);
          if (puVar4 == (uchar *)0x0) goto LAB_0010e946;
        }
        puVar5 = puVar4 + uVar6;
        uVar9 = uVar6;
        goto LAB_0010e93a;
      }
    }
    else {
      local_50 = (uchar *)0x0;
      uVar9 = 0;
      if (LVar1 != LCT_PALETTE) goto LAB_0010e946;
      sVar8 = info->palettesize;
      if (sVar8 != 0) {
        do {
          if (info->palette[sVar8 * 4 + -1] != 0xff) {
            sVar14 = 0;
            uVar13 = 0;
            uVar9 = 0;
            local_50 = (uchar *)0x0;
            goto LAB_0010e6dd;
          }
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
      }
    }
LAB_0010e6bd:
    local_50 = (uchar *)0x0;
    uVar9 = 0;
  }
LAB_0010e946:
  uVar3 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar9,"tRNS",local_50);
  if (uVar3 == 0) {
    out->allocsize = out->size;
  }
  free(local_50);
  return extraout_EAX;
LAB_0010e6dd:
  do {
    uVar10 = info->palette[sVar14 * 4 + 3];
    uVar15 = uVar9 + 1;
    puVar4 = local_50;
    uVar16 = uVar13;
    if (uVar13 < uVar15) {
      uVar16 = uVar15 * 3 >> 1;
      if (uVar13 * 2 < uVar15) {
        uVar16 = uVar15;
      }
      puVar4 = (uchar *)realloc(local_50,uVar16);
      if (puVar4 != (uchar *)0x0) goto LAB_0010e72c;
    }
    else {
LAB_0010e72c:
      uVar13 = uVar16;
      puVar4[uVar9] = uVar10;
      uVar9 = uVar15;
      local_50 = puVar4;
    }
    sVar14 = sVar14 + 1;
  } while (sVar8 != sVar14);
  goto LAB_0010e946;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector tRNS;
  ucvector_init(&tRNS);
  if(info->colortype == LCT_PALETTE)
  {
    size_t amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i)
    {
      if(info->palette[4 * (i - 1) + 3] == 255) --amount;
      else break;
    }
    /*add only alpha channel*/
    for(i = 0; i != amount; ++i) ucvector_push_back(&tRNS, info->palette[4 * i + 3]);
  }
  else if(info->colortype == LCT_GREY)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
    }
  }
  else if(info->colortype == LCT_RGB)
  {
    if(info->key_defined)
    {
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_r & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_g & 255));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b >> 8));
      ucvector_push_back(&tRNS, (unsigned char)(info->key_b & 255));
    }
  }

  error = addChunk(out, "tRNS", tRNS.data, tRNS.size);
  ucvector_cleanup(&tRNS);

  return error;
}